

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitArrayGet(BinaryInstWriter *this,ArrayGet *curr)

{
  bool bVar1;
  bool bVar2;
  BufferWithRandomAccess *this_00;
  U32LEB local_44;
  BasicType local_40;
  char local_39;
  int8_t op;
  Type *local_28;
  Field *field;
  HeapType heapType;
  ArrayGet *curr_local;
  BinaryInstWriter *this_local;
  
  heapType.id = (uintptr_t)curr;
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
  }
  else {
    field = (Field *)wasm::Type::getHeapType((Type *)(*(long *)(heapType.id + 0x10) + 8));
    HeapType::getArray((HeapType *)&stack0xffffffffffffffc8);
    local_28 = (Type *)&stack0xffffffffffffffc8;
    local_40 = i32;
    bVar2 = wasm::Type::operator!=(local_28,&local_40);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = (int)local_28[1].id == 0;
    }
    if (bVar1) {
      local_39 = '\v';
    }
    else if ((*(byte *)(heapType.id + 0x20) & 1) == 0) {
      local_39 = '\r';
    }
    else {
      local_39 = '\f';
    }
    this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_44,(int)local_39);
    BufferWithRandomAccess::operator<<(this_00,local_44);
    WasmBinaryWriter::writeIndexedHeapType(this->parent,(HeapType)field);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitArrayGet(ArrayGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getArray().element;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = BinaryConsts::ArrayGet;
  } else if (curr->signed_) {
    op = BinaryConsts::ArrayGetS;
  } else {
    op = BinaryConsts::ArrayGetU;
  }
  o << int8_t(BinaryConsts::GCPrefix) << U32LEB(op);
  parent.writeIndexedHeapType(heapType);
}